

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

bool __thiscall covenant::CFG::isOneLevelIndirectionTerminal(CFG *this,Sym *s)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_40;
  
  bVar5 = true;
  if ((s->x & 1U) != 0) {
    iVar4 = s->x >> 1;
    uVar6 = 0;
    bVar5 = true;
    while( true ) {
      pvVar1 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[iVar4].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[iVar4].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar6
         ) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_40,
                 (this->rules).
                 super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar2 + (ulong)uVar6 * 4));
      bVar3 = isAllTerminal((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_40);
      bVar5 = (bool)(bVar5 & bVar3);
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_40);
      uVar6 = uVar6 + 1;
    }
  }
  return bVar5;
}

Assistant:

bool isVar()  const  { return this->x&1; }